

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O2

void __thiscall
TopologicalSortTest_Singleton_Test::TestBody(TopologicalSortTest_Singleton_Test *this)

{
  pointer *this_00;
  char *pcVar1;
  initializer_list<unsigned_int> __l;
  undefined1 local_198 [8];
  TopologicalOrders orders;
  TopologicalOrdersImpl<std::monostate> it;
  Graph_conflict graph;
  allocator_type local_29;
  internal local_28 [8];
  AssertionResult gtest_ar;
  
  this_00 = &it.selectors.
             super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)this_00,1,(allocator_type *)local_198);
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)local_198,this_00);
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &orders.selectors.
              super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_198);
  ::wasm::TopologicalOrdersImpl<std::monostate>::end
            ((TopologicalOrdersImpl<std::monostate> *)
             &graph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (TopologicalOrdersImpl<std::monostate> *)local_198);
  testing::internal::
  CmpHelperNE<wasm::TopologicalOrdersImpl<std::monostate>,wasm::TopologicalOrdersImpl<std::monostate>>
            (local_28,"it","orders.end()",
             (TopologicalOrdersImpl<std::monostate> *)
             &orders.selectors.
              super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (TopologicalOrdersImpl<std::monostate> *)
             &graph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &graph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
               ,0x26,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,
               (Message *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (graph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)(((graph.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start + 2))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)&gtest_ar.message_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,&local_29);
    testing::internal::
    CmpHelperEQ<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
              (local_28,"*it","std::vector<Index>{0}",
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &it.indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)
                 &graph.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
                 ,0x27,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,
                 (Message *)
                 &graph.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (graph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        (**(code **)(((graph.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start + 2))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar);
    ::wasm::TopologicalOrdersImpl<std::monostate>::operator++
              ((TopologicalOrdersImpl<std::monostate> *)
               &orders.selectors.
                super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::wasm::TopologicalOrdersImpl<std::monostate>::end
              ((TopologicalOrdersImpl<std::monostate> *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (TopologicalOrdersImpl<std::monostate> *)local_198);
    testing::internal::
    CmpHelperEQ<wasm::TopologicalOrdersImpl<std::monostate>,wasm::TopologicalOrdersImpl<std::monostate>>
              (local_28,"it","orders.end()",
               (TopologicalOrdersImpl<std::monostate> *)
               &orders.selectors.
                super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (TopologicalOrdersImpl<std::monostate> *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
              ((TopologicalOrdersImpl<std::monostate> *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_28[0] == (internal)0x0) {
      testing::Message::Message
                ((Message *)
                 &graph.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (gtest_ar._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
                 ,0x29,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,
                 (Message *)
                 &graph.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (graph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        (**(code **)(((graph.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start + 2))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &orders.selectors.
              super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::wasm::TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)local_198);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&it.selectors.
                super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(TopologicalSortTest, Singleton) {
  Graph graph(1);
  TopologicalOrders orders(graph);
  auto it = orders.begin();
  ASSERT_NE(it, orders.end());
  EXPECT_EQ(*it, std::vector<Index>{0});
  ++it;
  EXPECT_EQ(it, orders.end());
}